

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void sgai_median_patch_values
               (Integer type,Integer ndim,Integer *loA,Integer *hiA,Integer *ldA,void *A_ptr,
               void *B_ptr,void *C_ptr,void *M_ptr,Integer offset)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined1 auVar7 [16];
  int iVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  uint *puVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  ulong in_R11;
  long lVar24;
  long lVar25;
  float fVar26;
  undefined4 uVar27;
  float fVar28;
  undefined4 uVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  double dVar34;
  double dVar35;
  undefined1 auVar36 [16];
  double dVar38;
  undefined1 auVar37 [16];
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double dVar43;
  undefined1 auVar42 [16];
  float fVar44;
  float fVar45;
  double dVar46;
  double dVar47;
  Integer baseldA [7];
  ulong uStack_f0;
  undefined1 local_e8 [48];
  void *local_b8;
  void *local_b0;
  long local_a8 [8];
  long alStack_68 [7];
  
  lVar20 = 1;
  if (1 < ndim) {
    lVar13 = 1;
    do {
      lVar20 = lVar20 * ((hiA[lVar13] - loA[lVar13]) + 1);
      lVar13 = lVar13 + 1;
    } while (ndim != lVar13);
  }
  uStack_f0 = 0;
  alStack_68[1] = 1;
  local_a8[0] = *ldA;
  lVar13 = *ldA * ldA[1];
  local_a8[1] = lVar13;
  if (2 < ndim) {
    memset(local_e8,0,ndim * 8 - 0x10);
    lVar14 = 2;
    lVar18 = 1;
    do {
      lVar18 = lVar18 * ((hiA[lVar14 + -1] - loA[lVar14 + -1]) + 1);
      alStack_68[lVar14] = lVar18;
      lVar13 = lVar13 * ldA[lVar14];
      local_a8[lVar14] = lVar13;
      lVar14 = lVar14 + 1;
    } while (ndim != lVar14);
  }
  puVar19 = &switchD_00169a4e::switchdataD_001b7e00;
  switch(type) {
  case 0x3e9:
    if (0 < lVar20) {
      lVar13 = *hiA;
      lVar14 = *loA;
      local_b0 = (void *)((long)M_ptr + offset * 4);
      local_b8 = (void *)((long)C_ptr + offset * 4);
      lVar18 = 0;
      do {
        if (ndim < 2) {
          lVar24 = 0;
        }
        else {
          lVar25 = 0;
          lVar24 = 0;
          do {
            lVar24 = lVar24 + local_a8[lVar25] * *(long *)(local_e8 + lVar25 * 8 + -8);
            lVar21 = *(long *)(local_e8 + lVar25 * 8 + -8) +
                     (ulong)((lVar18 + 1) % alStack_68[lVar25 + 1] == 0);
            lVar15 = 0;
            if (lVar21 <= hiA[lVar25 + 1] - loA[lVar25 + 1]) {
              lVar15 = lVar21;
            }
            *(long *)(local_e8 + lVar25 * 8 + -8) = lVar15;
            lVar25 = lVar25 + 1;
          } while (ndim + -1 != lVar25);
        }
        if (lVar14 <= lVar13) {
          lVar25 = 0;
          do {
            iVar4 = *(int *)((long)A_ptr + lVar25 * 4 + lVar24 * 4 + offset * 4);
            iVar5 = *(int *)((long)B_ptr + lVar25 * 4 + lVar24 * 4 + offset * 4);
            iVar23 = iVar4;
            if (iVar4 != iVar5) {
              iVar6 = *(int *)((long)local_b8 + lVar25 * 4 + lVar24 * 4);
              if (iVar4 < iVar5) {
                if ((iVar4 <= iVar6) && (iVar23 = iVar5, iVar6 < iVar5)) {
                  iVar23 = iVar6;
                }
              }
              else if ((iVar4 <= iVar5) || (iVar23 = iVar5, iVar5 <= iVar6)) {
                iVar8 = iVar4;
                if (iVar6 < iVar4) {
                  iVar8 = iVar6;
                }
                iVar23 = iVar4;
                if (iVar5 <= iVar6) {
                  iVar23 = iVar8;
                }
              }
            }
            *(int *)((long)local_b0 + lVar25 * 4 + lVar24 * 4) = iVar23;
            lVar25 = lVar25 + 1;
          } while ((lVar13 - lVar14) + 1 != lVar25);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != lVar20);
    }
    break;
  case 0x3ea:
    if (0 < lVar20) {
      lVar13 = 0;
      do {
        if (ndim < 2) {
          lVar14 = 0;
        }
        else {
          lVar18 = 0;
          lVar14 = 0;
          do {
            lVar14 = lVar14 + local_a8[lVar18] * *(long *)(local_e8 + lVar18 * 8 + -8);
            lVar25 = *(long *)(local_e8 + lVar18 * 8 + -8) +
                     (ulong)((lVar13 + 1) % alStack_68[lVar18 + 1] == 0);
            lVar24 = 0;
            if (lVar25 <= hiA[lVar18 + 1] - loA[lVar18 + 1]) {
              lVar24 = lVar25;
            }
            *(long *)(local_e8 + lVar18 * 8 + -8) = lVar24;
            lVar18 = lVar18 + 1;
          } while (ndim + -1 != lVar18);
        }
        if (*loA <= *hiA) {
          lVar18 = -1;
          do {
            lVar24 = *(long *)((long)A_ptr + lVar18 * 8 + lVar14 * 8 + offset * 8 + 8);
            lVar25 = *(long *)((long)B_ptr + lVar18 * 8 + lVar14 * 8 + offset * 8 + 8);
            lVar15 = lVar24;
            if (lVar24 != lVar25) {
              lVar21 = *(long *)((long)C_ptr + lVar18 * 8 + lVar14 * 8 + offset * 8 + 8);
              if (lVar24 < lVar25) {
                if ((lVar24 <= lVar21) && (lVar15 = lVar25, lVar21 < lVar25)) {
                  lVar15 = lVar21;
                }
              }
              else if ((lVar24 <= lVar25) || (lVar15 = lVar25, lVar25 <= lVar21)) {
                lVar22 = lVar24;
                if (lVar21 < lVar24) {
                  lVar22 = lVar21;
                }
                lVar15 = lVar24;
                if (lVar25 <= lVar21) {
                  lVar15 = lVar22;
                }
              }
            }
            *(long *)((long)M_ptr + lVar18 * 8 + lVar14 * 8 + offset * 8 + 8) = lVar15;
            lVar18 = lVar18 + 1;
          } while (lVar18 < *hiA - *loA);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar20);
    }
    break;
  case 0x3eb:
    if (0 < lVar20) {
      lVar13 = *hiA;
      lVar14 = *loA;
      lVar18 = 0;
      do {
        if (ndim < 2) {
          lVar24 = 0;
        }
        else {
          lVar25 = 0;
          lVar24 = 0;
          do {
            lVar24 = lVar24 + local_a8[lVar25] * *(long *)(local_e8 + lVar25 * 8 + -8);
            lVar21 = *(long *)(local_e8 + lVar25 * 8 + -8) +
                     (ulong)((lVar18 + 1) % alStack_68[lVar25 + 1] == 0);
            lVar15 = 0;
            if (lVar21 <= hiA[lVar25 + 1] - loA[lVar25 + 1]) {
              lVar15 = lVar21;
            }
            *(long *)(local_e8 + lVar25 * 8 + -8) = lVar15;
            lVar25 = lVar25 + 1;
          } while (ndim + -1 != lVar25);
        }
        if (lVar14 <= lVar13) {
          lVar25 = 0;
          do {
            fVar28 = *(float *)((long)A_ptr + lVar25 * 4 + lVar24 * 4 + offset * 4);
            fVar30 = *(float *)((long)B_ptr + lVar25 * 4 + lVar24 * 4 + offset * 4);
            if ((fVar28 != fVar30) || (NAN(fVar28) || NAN(fVar30))) {
              fVar26 = *(float *)((long)C_ptr + lVar25 * 4 + lVar24 * 4 + offset * 4);
              if (fVar30 <= fVar28) {
                if ((fVar28 <= fVar30) || (fVar30 <= fVar26)) {
                  if ((fVar30 <= fVar26) && (fVar26 <= fVar28)) goto LAB_00169c9e;
                  goto LAB_00169c9b;
                }
LAB_00169cd4:
                fVar26 = fVar30;
              }
              else {
                if (fVar26 < fVar28) goto LAB_00169c9b;
                if ((fVar26 < fVar28) || (fVar30 < fVar26)) goto LAB_00169cd4;
              }
            }
            else {
LAB_00169c9b:
              fVar26 = fVar28;
            }
LAB_00169c9e:
            *(float *)((long)M_ptr + lVar25 * 4 + lVar24 * 4 + offset * 4) = fVar26;
            lVar25 = lVar25 + 1;
          } while ((lVar13 - lVar14) + 1 != lVar25);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != lVar20);
    }
    break;
  case 0x3ec:
    if (0 < lVar20) {
      lVar13 = *hiA;
      lVar14 = *loA;
      lVar18 = 0;
      do {
        if (ndim < 2) {
          lVar24 = 0;
        }
        else {
          lVar25 = 0;
          lVar24 = 0;
          do {
            lVar24 = lVar24 + local_a8[lVar25] * *(long *)(local_e8 + lVar25 * 8 + -8);
            lVar21 = *(long *)(local_e8 + lVar25 * 8 + -8) +
                     (ulong)((lVar18 + 1) % alStack_68[lVar25 + 1] == 0);
            lVar15 = 0;
            if (lVar21 <= hiA[lVar25 + 1] - loA[lVar25 + 1]) {
              lVar15 = lVar21;
            }
            *(long *)(local_e8 + lVar25 * 8 + -8) = lVar15;
            lVar25 = lVar25 + 1;
          } while (ndim + -1 != lVar25);
        }
        if (lVar14 <= lVar13) {
          lVar25 = 0;
          do {
            dVar35 = *(double *)((long)A_ptr + lVar25 * 8 + lVar24 * 8 + offset * 8);
            dVar39 = *(double *)((long)B_ptr + lVar25 * 8 + lVar24 * 8 + offset * 8);
            if ((dVar35 != dVar39) || (NAN(dVar35) || NAN(dVar39))) {
              dVar38 = *(double *)((long)C_ptr + lVar25 * 8 + lVar24 * 8 + offset * 8);
              uVar27 = SUB84(dVar38,0);
              uVar29 = (undefined4)((ulong)dVar38 >> 0x20);
              if (dVar39 <= dVar35) {
                if ((dVar35 <= dVar39) || (dVar39 <= dVar38)) {
                  if ((dVar39 <= dVar38) && (dVar38 <= dVar35)) goto LAB_0016a0c8;
                  goto LAB_0016a0c4;
                }
LAB_0016a104:
                uVar27 = SUB84(dVar39,0);
                uVar29 = (undefined4)((ulong)dVar39 >> 0x20);
              }
              else {
                if (dVar38 < dVar35) goto LAB_0016a0c4;
                if ((dVar38 < dVar35) || (dVar39 < dVar38)) goto LAB_0016a104;
              }
            }
            else {
LAB_0016a0c4:
              uVar27 = SUB84(dVar35,0);
              uVar29 = (undefined4)((ulong)dVar35 >> 0x20);
            }
LAB_0016a0c8:
            *(ulong *)((long)M_ptr + lVar25 * 8 + lVar24 * 8 + offset * 8) = CONCAT44(uVar29,uVar27)
            ;
            lVar25 = lVar25 + 1;
          } while ((lVar13 - lVar14) + 1 != lVar25);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != lVar20);
    }
    break;
  default:
    pnga_error("median: wrong data type",type);
    return;
  case 0x3ee:
    if (0 < lVar20) {
      lVar13 = *hiA;
      lVar14 = *loA;
      lVar18 = 0;
      do {
        if (ndim < 2) {
          lVar24 = 0;
        }
        else {
          lVar25 = 0;
          lVar24 = 0;
          do {
            lVar24 = lVar24 + local_a8[lVar25] * *(long *)(local_e8 + lVar25 * 8 + -8);
            in_R11 = *(long *)(local_e8 + lVar25 * 8 + -8) +
                     (ulong)((lVar18 + 1) % alStack_68[lVar25 + 1] == 0);
            uVar16 = 0;
            if ((long)in_R11 <= hiA[lVar25 + 1] - loA[lVar25 + 1]) {
              uVar16 = in_R11;
            }
            *(ulong *)(local_e8 + lVar25 * 8 + -8) = uVar16;
            lVar25 = lVar25 + 1;
          } while (ndim + -1 != lVar25);
        }
        if (lVar14 <= lVar13) {
          lVar25 = 0;
          do {
            uVar1 = *(undefined8 *)((long)A_ptr + lVar25 * 8 + lVar24 * 8 + offset * 8);
            uVar2 = *(undefined8 *)((long)B_ptr + lVar25 * 8 + lVar24 * 8 + offset * 8);
            uVar3 = *(undefined8 *)((long)C_ptr + lVar25 * 8 + lVar24 * 8 + offset * 8);
            fVar28 = (float)uVar3;
            fVar30 = (float)((ulong)uVar3 >> 0x20);
            fVar32 = (float)uVar2;
            fVar33 = (float)((ulong)uVar2 >> 0x20);
            auVar36._0_8_ = (double)(fVar32 * fVar32 + fVar33 * fVar33);
            auVar36._8_8_ = 0;
            fVar26 = (float)uVar1;
            fVar31 = (float)((ulong)uVar1 >> 0x20);
            dVar35 = (double)(fVar28 * fVar28 + fVar30 * fVar30);
            dVar39 = SQRT(auVar36._0_8_);
            auVar7._8_4_ = SUB84(dVar35,0);
            auVar7._0_8_ = (double)(fVar26 * fVar26 + fVar31 * fVar31);
            auVar7._12_4_ = (int)((ulong)dVar35 >> 0x20);
            auVar41 = sqrtpd(auVar36,auVar7);
            dVar35 = auVar41._0_8_;
            if ((dVar35 != dVar39) || (NAN(dVar35) || NAN(dVar39))) {
              dVar38 = auVar41._8_8_;
              if (dVar39 <= dVar35) {
                if (((dVar35 <= dVar39) || (fVar44 = fVar32, fVar45 = fVar33, dVar39 <= dVar38)) &&
                   ((dVar38 < dVar39 || (fVar44 = fVar28, fVar45 = fVar30, dVar35 < dVar38))))
                goto LAB_0016a25e;
              }
              else {
                fVar44 = fVar26;
                fVar45 = fVar31;
                if (dVar35 <= dVar38) {
                  auVar37._8_8_ = -(ulong)(dVar39 < dVar38);
                  auVar37._0_8_ = -(ulong)(dVar38 < dVar35);
                  uVar17 = movmskpd((int)in_R11,auVar37);
                  in_R11 = (ulong)uVar17;
                  fVar44 = fVar28;
                  fVar45 = fVar30;
                  if (uVar17 != 0) {
                    fVar44 = fVar32;
                    fVar45 = fVar33;
                  }
                }
              }
            }
            else {
LAB_0016a25e:
              fVar44 = fVar26;
              fVar45 = fVar31;
            }
            *(ulong *)((long)M_ptr + lVar25 * 8 + lVar24 * 8 + offset * 8) = CONCAT44(fVar45,fVar44)
            ;
            lVar25 = lVar25 + 1;
          } while ((lVar13 - lVar14) + 1 != lVar25);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != lVar20);
    }
    break;
  case 0x3ef:
    if (0 < lVar20) {
      lVar13 = *hiA;
      lVar14 = *loA;
      lVar18 = 0;
      do {
        if (ndim < 2) {
          lVar24 = 0;
        }
        else {
          puVar19 = (uint *)(lVar18 + 1);
          lVar25 = 0;
          lVar24 = 0;
          do {
            lVar24 = lVar24 + local_a8[lVar25] * *(long *)(local_e8 + lVar25 * 8 + -8);
            lVar21 = *(long *)(local_e8 + lVar25 * 8 + -8) +
                     (ulong)((long)puVar19 % alStack_68[lVar25 + 1] == 0);
            lVar15 = 0;
            if (lVar21 <= hiA[lVar25 + 1] - loA[lVar25 + 1]) {
              lVar15 = lVar21;
            }
            *(long *)(local_e8 + lVar25 * 8 + -8) = lVar15;
            lVar25 = lVar25 + 1;
          } while (ndim + -1 != lVar25);
        }
        if (lVar14 <= lVar13) {
          lVar25 = lVar24 * 0x10 + offset * 0x10;
          lVar24 = (lVar13 - lVar14) + 1;
          do {
            dVar39 = *(double *)((long)A_ptr + lVar25);
            dVar38 = ((double *)((long)A_ptr + lVar25))[1];
            dVar9 = *(double *)((long)B_ptr + lVar25);
            dVar10 = ((double *)((long)B_ptr + lVar25))[1];
            dVar11 = *(double *)((long)C_ptr + lVar25);
            dVar12 = ((double *)((long)C_ptr + lVar25))[1];
            dVar34 = SQRT(dVar9 * dVar9 + dVar10 * dVar10);
            auVar40._0_8_ = dVar38 * dVar38;
            auVar40._8_8_ = dVar12 * dVar12;
            dVar35 = dVar11 * dVar11 + auVar40._8_8_;
            auVar41._8_4_ = SUB84(dVar35,0);
            auVar41._0_8_ = dVar39 * dVar39 + auVar40._0_8_;
            auVar41._12_4_ = (int)((ulong)dVar35 >> 0x20);
            auVar41 = sqrtpd(auVar40,auVar41);
            dVar35 = auVar41._0_8_;
            if ((dVar35 != dVar34) || (NAN(dVar35) || NAN(dVar34))) {
              dVar43 = auVar41._8_8_;
              if (dVar34 <= dVar35) {
                if (((dVar35 <= dVar34) || (dVar46 = dVar9, dVar47 = dVar10, dVar34 <= dVar43)) &&
                   ((dVar43 < dVar34 || (dVar46 = dVar11, dVar47 = dVar12, dVar35 < dVar43))))
                goto LAB_00169dff;
              }
              else {
                dVar46 = dVar39;
                dVar47 = dVar38;
                if (dVar35 <= dVar43) {
                  auVar42._8_8_ = -(ulong)(dVar34 < dVar43);
                  auVar42._0_8_ = -(ulong)(dVar43 < dVar35);
                  uVar17 = movmskpd((int)puVar19,auVar42);
                  puVar19 = (uint *)(ulong)uVar17;
                  dVar46 = dVar11;
                  dVar47 = dVar12;
                  if (uVar17 != 0) {
                    dVar46 = dVar9;
                    dVar47 = dVar10;
                  }
                }
              }
            }
            else {
LAB_00169dff:
              dVar46 = dVar39;
              dVar47 = dVar38;
            }
            *(double *)((long)M_ptr + lVar25) = dVar46;
            ((double *)((long)M_ptr + lVar25))[1] = dVar47;
            lVar25 = lVar25 + 0x10;
            lVar24 = lVar24 + -1;
          } while (lVar24 != 0);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != lVar20);
    }
  }
  return;
}

Assistant:

static void sgai_median_patch_values(Integer type, Integer ndim, Integer *loA,
                              Integer *hiA, Integer *ldA, void *A_ptr,
                              void *B_ptr, void *C_ptr, void *M_ptr,
                              Integer offset)
{
  Integer bvalue[MAXDIM], bunit[MAXDIM], baseldA[MAXDIM];
  Integer idx, n1dim;
  Integer i, j;

  double na, nb, nc;            /*norm of a, norm of b, norm of c */
  int ia, ib, ic, im;
  float fa, fb, fc, fm;
  double da, db, dc, dm;
  long la, lb, lc, lm;
  DoubleComplex za, zb, zc, zm;
  SingleComplex ca, cb, cc, cm;

  /* number of n-element of the first dimension */
  n1dim = 1;
  for (i = 1; i < ndim; i++)
    n1dim *= (hiA[i] - loA[i] + 1);

  /* calculate the destination indices */
  bvalue[0] = 0;
  bvalue[1] = 0;
  bunit[0] = 1;
  bunit[1] = 1;
  /* baseldA[0] = ldA[0]
   * baseldA[1] = ldA[0] * ldA[1]
   * baseldA[2] = ldA[0] * ldA[1] * ldA[2] .....
   */
  baseldA[0] = ldA[0];
  baseldA[1] = baseldA[0] * ldA[1];
  for (i = 2; i < ndim; i++)
  {
    bvalue[i] = 0;
    bunit[i] = bunit[i - 1] * (hiA[i - 1] - loA[i - 1] + 1);
    baseldA[i] = baseldA[i - 1] * ldA[i];
  }
  switch(type) {
    case C_DBL:
      A_ptr = (void*)((double*)(A_ptr) + offset);
      B_ptr = (void*)((double*)(B_ptr) + offset);
      C_ptr = (void*)((double*)(C_ptr) + offset);
      M_ptr = (void*)((double*)(M_ptr) + offset);
      break;
    case C_INT:
      A_ptr = (void*)((int*)(A_ptr) + offset);
      B_ptr = (void*)((int*)(B_ptr) + offset);
      C_ptr = (void*)((int*)(C_ptr) + offset);
      M_ptr = (void*)((int*)(M_ptr) + offset);
      break;
    case C_DCPL:
      A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
      B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
      C_ptr = (void*)((DoubleComplex*)(C_ptr) + offset);
      M_ptr = (void*)((DoubleComplex*)(M_ptr) + offset);
      break;
    case C_SCPL:
      A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
      B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
      C_ptr = (void*)((SingleComplex*)(C_ptr) + offset);
      M_ptr = (void*)((SingleComplex*)(M_ptr) + offset);
      break;
    case C_FLOAT:
      A_ptr = (void*)((float*)(A_ptr) + offset);
      B_ptr = (void*)((float*)(B_ptr) + offset);
      C_ptr = (void*)((float*)(C_ptr) + offset);
      M_ptr = (void*)((float*)(M_ptr) + offset);
      break;
    case C_LONG:
      A_ptr = (void*)((long*)(A_ptr) + offset);
      B_ptr = (void*)((long*)(B_ptr) + offset);
      C_ptr = (void*)((long*)(C_ptr) + offset);
      M_ptr = (void*)((long*)(M_ptr) + offset);
      break;
    case C_LONGLONG:
      A_ptr = (void*)((long long*)(A_ptr) + offset);
      B_ptr = (void*)((long long*)(B_ptr) + offset);
      C_ptr = (void*)((long long*)(C_ptr) + offset);
      M_ptr = (void*)((long long*)(M_ptr) + offset);
      break;
    default:
      break;
  }

  /*compute elementwise median */

  switch (type) {

    case C_INT: 
      for (i = 0; i < n1dim; i++) {
        idx = 0;
        for (j = 1; j < ndim; j++) {
          idx += bvalue[j] * baseldA[j - 1];
          if (((i + 1) % bunit[j]) == 0)     bvalue[j]++;
          if (bvalue[j] > (hiA[j] - loA[j])) bvalue[j] = 0;
        }
        for (j = 0; j < (hiA[0] - loA[0] + 1); j++) {
          ia = ((int *) A_ptr)[idx + j];
          ib = ((int *) B_ptr)[idx + j];
          ic = ((int *) C_ptr)[idx + j];
          median(ia, ib, ic, im);
          ((int *) M_ptr)[idx + j] = im;
        }
      }
      break;
    case C_LONG: 
      for (i = 0; i < n1dim; i++) {
        idx = 0;
        for (j = 1; j < ndim; j++) {
          idx += bvalue[j] * baseldA[j - 1];
          if (((i + 1) % bunit[j]) == 0)     bvalue[j]++;
          if (bvalue[j] > (hiA[j] - loA[j])) bvalue[j] = 0;
        }
        for (j = 0; j < (hiA[0] - loA[0] + 1); j++) {
          la = ((long *) A_ptr)[idx + j];
          lb = ((long *) B_ptr)[idx + j];
          lc = ((long *) C_ptr)[idx + j];
          median(la, lb, lc, lm);
          ((long *) M_ptr)[idx + j] = lm;
        }
      }
      break;
    case C_FLOAT: 
      for (i = 0; i < n1dim; i++) {
        idx = 0;
        for (j = 1; j < ndim; j++) {
          idx += bvalue[j] * baseldA[j - 1];
          if (((i + 1) % bunit[j]) == 0)     bvalue[j]++;
          if (bvalue[j] > (hiA[j] - loA[j])) bvalue[j] = 0;
        }
        for (j = 0; j < (hiA[0] - loA[0] + 1); j++) {
          fa = ((float *) A_ptr)[idx + j];
          fb = ((float *) B_ptr)[idx + j];
          fc = ((float *) C_ptr)[idx + j];
          median(fa, fb, fc, fm);
          ((float *) M_ptr)[idx + j] = fm;
        }
      }
      break;
    case C_DBL: 
      for (i = 0; i < n1dim; i++) {
        idx = 0;
        for (j = 1; j < ndim; j++) {
          idx += bvalue[j] * baseldA[j - 1];
          if (((i + 1) % bunit[j]) == 0)     bvalue[j]++;
          if (bvalue[j] > (hiA[j] - loA[j])) bvalue[j] = 0;
        }
        for (j = 0; j < (hiA[0] - loA[0] + 1); j++) {
          da = ((double *) A_ptr)[idx + j];
          db = ((double *) B_ptr)[idx + j];
          dc = ((double *) C_ptr)[idx + j];
          median(da, db, dc, dm);
          ((double *) M_ptr)[idx + j] = dm;
        }
      }
      break;
    case C_DCPL:
      for (i = 0; i < n1dim; i++) {
        idx = 0;
        for (j = 1; j < ndim; j++) {
          idx += bvalue[j] * baseldA[j - 1];
          if (((i + 1) % bunit[j]) == 0)     bvalue[j]++;
          if (bvalue[j] > (hiA[j] - loA[j])) bvalue[j] = 0;
        }
        for (j = 0; j < (hiA[0] - loA[0] + 1); j++) {
          za = ((DoubleComplex *) A_ptr)[idx + j];
          zb = ((DoubleComplex *) B_ptr)[idx + j];
          zc = ((DoubleComplex *) C_ptr)[idx + j];
          na = sqrt ((za.real) * (za.real) + (za.imag) * (za.imag));
          nb = sqrt ((zb.real) * (zb.real) + (zb.imag) * (zb.imag));
          nc = sqrt ((zc.real) * (zc.real) + (zc.imag) * (zc.imag));
          median_dcpl(na, nb, nc, za, zb, zc, zm);
          ((DoubleComplex *) M_ptr)[idx + j] = zm;
        }
      }
      break;

    case C_SCPL:
      for (i = 0; i < n1dim; i++) {
        idx = 0;
        for (j = 1; j < ndim; j++) {
          idx += bvalue[j] * baseldA[j - 1];
          if (((i + 1) % bunit[j]) == 0)     bvalue[j]++;
          if (bvalue[j] > (hiA[j] - loA[j])) bvalue[j] = 0;
        }
        for (j = 0; j < (hiA[0] - loA[0] + 1); j++) {
          ca = ((SingleComplex *) A_ptr)[idx + j];
          cb = ((SingleComplex *) B_ptr)[idx + j];
          cc = ((SingleComplex *) C_ptr)[idx + j];
          na = sqrt ((ca.real) * (ca.real) + (ca.imag) * (ca.imag));
          nb = sqrt ((cb.real) * (cb.real) + (cb.imag) * (cb.imag));
          nc = sqrt ((cc.real) * (cc.real) + (cc.imag) * (cc.imag));
          median_scpl(na, nb, nc, ca, cb, cc, cm);
          ((SingleComplex *) M_ptr)[idx + j] = cm;
        }
      }
      break;
    default:
      pnga_error("median: wrong data type", type);
  }
}